

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Variability v)

{
  allocator local_18;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  int local_14;
  string *psStack_10;
  Variability v_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"varying",&local_15);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (local_14 == 1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"uniform",&local_16);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_16);
  }
  else if (local_14 == 2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"config",&local_17);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_17);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"\"[[VariabilityInvalid]]\"",&local_18);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::Variability v) {
  if (v == tinyusdz::Variability::Varying) {
    return "varying";
  } else if (v == tinyusdz::Variability::Uniform) {
    return "uniform";
  } else if (v == tinyusdz::Variability::Config) {
    return "config";
  } else {
    return "\"[[VariabilityInvalid]]\"";
  }
}